

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O1

void duckdb::SinkDataChunk
               (Vector *child_vector,SelectionVector *sel,idx_t offset_lists_indices,
               vector<duckdb::LogicalType,_true> *types,
               vector<duckdb::LogicalType,_true> *payload_types,Vector *payload_vector,
               LocalSortState *param_7,bool *data_to_sort,Vector *lists_indices)

{
  reference pvVar1;
  DataChunk key_chunk;
  DataChunk payload_chunk;
  Vector slice;
  vector<duckdb::Vector,_true> vStack_108;
  idx_t local_f0;
  vector<duckdb::Vector,_true> local_c8;
  idx_t local_b0;
  Vector local_88 [8];
  LogicalType local_80 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  duckdb::Vector::Vector(local_88,child_vector,sel,offset_lists_indices);
  duckdb::DataChunk::DataChunk((DataChunk *)&vStack_108);
  duckdb::DataChunk::InitializeEmpty((vector *)&vStack_108);
  pvVar1 = vector<duckdb::Vector,_true>::operator[](&vStack_108,0);
  duckdb::Vector::Reference(pvVar1);
  pvVar1 = vector<duckdb::Vector,_true>::operator[](&vStack_108,1);
  duckdb::Vector::Reference(pvVar1);
  local_f0 = offset_lists_indices;
  duckdb::DataChunk::DataChunk((DataChunk *)&local_c8);
  duckdb::DataChunk::InitializeEmpty((vector *)&local_c8);
  pvVar1 = vector<duckdb::Vector,_true>::operator[](&local_c8,0);
  duckdb::Vector::Reference(pvVar1);
  local_b0 = offset_lists_indices;
  duckdb::DataChunk::Verify();
  duckdb::DataChunk::Verify();
  duckdb::DataChunk::Flatten();
  duckdb::LocalSortState::SinkChunk((DataChunk *)param_7,(DataChunk *)&vStack_108);
  *data_to_sort = true;
  duckdb::DataChunk::~DataChunk((DataChunk *)&local_c8);
  duckdb::DataChunk::~DataChunk((DataChunk *)&vStack_108);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  duckdb::LogicalType::~LogicalType(local_80);
  return;
}

Assistant:

void SinkDataChunk(Vector *child_vector, SelectionVector &sel, idx_t offset_lists_indices, vector<LogicalType> &types,
                   vector<LogicalType> &payload_types, Vector &payload_vector, LocalSortState &local_sort_state,
                   bool &data_to_sort, Vector &lists_indices) {

	// slice the child vector
	Vector slice(*child_vector, sel, offset_lists_indices);

	// initialize and fill key_chunk
	DataChunk key_chunk;
	key_chunk.InitializeEmpty(types);
	key_chunk.data[0].Reference(lists_indices);
	key_chunk.data[1].Reference(slice);
	key_chunk.SetCardinality(offset_lists_indices);

	// initialize and fill key_chunk and payload_chunk
	DataChunk payload_chunk;
	payload_chunk.InitializeEmpty(payload_types);
	payload_chunk.data[0].Reference(payload_vector);
	payload_chunk.SetCardinality(offset_lists_indices);

	key_chunk.Verify();
	payload_chunk.Verify();

	// sink
	key_chunk.Flatten();
	local_sort_state.SinkChunk(key_chunk, payload_chunk);
	data_to_sort = true;
}